

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O3

void ImGui_ImplOpenGL3_DestroyFontsTexture(void)

{
  ImGuiIO *pIVar1;
  ImGuiIO *pIVar2;
  undefined4 *puVar3;
  
  pIVar1 = ImGui::GetIO();
  ImGui::GetCurrentContext();
  pIVar2 = ImGui::GetIO();
  if (*(int *)((long)pIVar2->BackendRendererUserData + 0x24) != 0) {
    puVar3 = (undefined4 *)((long)pIVar2->BackendRendererUserData + 0x24);
    (*imgl3wProcs.ptr[0x13])(1,puVar3);
    pIVar1->Fonts->TexID = (ImTextureID)0x0;
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ImGui_ImplOpenGL3_DestroyFontsTexture()
{
    ImGuiIO& io = ImGui::GetIO();
    ImGui_ImplOpenGL3_Data* bd = ImGui_ImplOpenGL3_GetBackendData();
    if (bd->FontTexture)
    {
        glDeleteTextures(1, &bd->FontTexture);
        io.Fonts->SetTexID(0);
        bd->FontTexture = 0;
    }
}